

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

SatLookAngles *
getSatellitesAndLookAngles
          (SatLookAngles *__return_storage_ptr__,double lat,double lon,double alt,DB *db)

{
  bool bVar1;
  Tle local_158;
  reference local_80;
  Tle *tle;
  iterator __end1;
  iterator __begin1;
  vector<Tle,_std::allocator<Tle>_> *__range1;
  undefined1 local_50 [8];
  vector<Tle,_std::allocator<Tle>_> tles;
  DB *db_local;
  double alt_local;
  double lon_local;
  double lat_local;
  SatLookAngles *sats;
  
  tles.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  SatLookAngles::SatLookAngles(__return_storage_ptr__,lat,lon,alt);
  (**db->_vptr_DB)(local_50);
  __end1 = std::vector<Tle,_std::allocator<Tle>_>::begin
                     ((vector<Tle,_std::allocator<Tle>_> *)local_50);
  tle = (Tle *)std::vector<Tle,_std::allocator<Tle>_>::end
                         ((vector<Tle,_std::allocator<Tle>_> *)local_50);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_> *)
                               &tle);
    if (!bVar1) break;
    local_80 = __gnu_cxx::__normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_>::
               operator*(&__end1);
    Tle::Tle(&local_158,local_80);
    SatLookAngles::add(__return_storage_ptr__,&local_158);
    Tle::~Tle(&local_158);
    __gnu_cxx::__normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_>::operator++
              (&__end1);
  }
  SatLookAngles::sort(__return_storage_ptr__);
  tles.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  std::vector<Tle,_std::allocator<Tle>_>::~vector((vector<Tle,_std::allocator<Tle>_> *)local_50);
  if ((tles.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._7_1_ & 1) == 0) {
    SatLookAngles::~SatLookAngles(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

SatLookAngles getSatellitesAndLookAngles(double lat, double lon, double alt,
                                         DB &db) {
  SatLookAngles sats(lat, lon, alt);

  // Get the TLEs.
  std::vector<Tle> tles = db.fetchTLEs();

  // Add the TLEs (this will automatically generate look angles.).
  for (const auto &tle : tles)
    sats.add(tle);

  // Sort by increasing range.
  sats.sort();
  return sats;
}